

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [13];
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,testRunStats);
  std::__cxx11::string::string(local_b0,"OverallResults",(allocator *)(local_30 + 0xc));
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->m_xml);
  std::__cxx11::string::string((string *)&local_90,"successes",&local_23);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_30._0_8_,&local_90,(unsigned_long *)&testRunStats->totals);
  std::__cxx11::string::string((string *)&local_70,"failures",&local_22);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_30._0_8_,&local_70,&(testRunStats->totals).assertions.failed);
  std::__cxx11::string::string((string *)&local_50,"expectedFailures",&local_21);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_30._0_8_,&local_50,&(testRunStats->totals).assertions.failedButOk);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  std::__cxx11::string::~string(local_b0);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void testRunEnded(TestRunStats const& testRunStats) CATCH_OVERRIDE {
			StreamingReporterBase::testRunEnded(testRunStats);
			m_xml.scopedElement("OverallResults")
				.writeAttribute("successes", testRunStats.totals.assertions.passed)
				.writeAttribute("failures", testRunStats.totals.assertions.failed)
				.writeAttribute("expectedFailures", testRunStats.totals.assertions.failedButOk);
			m_xml.endElement();
		}